

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  MQTT *pMVar1;
  
  pMVar1 = (data->req).p.mqtt;
  (*Curl_cfree)(pMVar1->sendleftovers);
  pMVar1->sendleftovers = (char *)0x0;
  Curl_dyn_free(&pMVar1->recvbuf);
  return CURLE_OK;
}

Assistant:

static CURLcode mqtt_done(struct Curl_easy *data,
                          CURLcode status, bool premature)
{
  struct MQTT *mq = data->req.p.mqtt;
  (void)status;
  (void)premature;
  Curl_safefree(mq->sendleftovers);
  Curl_dyn_free(&mq->recvbuf);
  return CURLE_OK;
}